

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImathRandom.h
# Opt level: O0

Vec3<float> Imath_2_5::solidSphereRand<Imath_2_5::Vec3<float>,Imath_2_5::Rand32>(Rand32 *rand)

{
  uint uVar1;
  float *pfVar2;
  Vec3<float> *in_RDI;
  undefined4 extraout_XMM0_Db;
  Vec3<float> VVar3;
  uint i;
  Vec3<float> *v;
  float in_stack_ffffffffffffffc8;
  float in_stack_ffffffffffffffcc;
  float in_stack_ffffffffffffffd0;
  uint uVar4;
  undefined4 local_14;
  
  Vec3<float>::Vec3(in_RDI);
  do {
    local_14 = 0;
    while( true ) {
      uVar4 = local_14;
      uVar1 = Vec3<float>::dimensions();
      if (uVar1 <= uVar4) break;
      in_stack_ffffffffffffffd0 =
           Rand32::nextf((Rand32 *)CONCAT44(uVar4,in_stack_ffffffffffffffd0),
                         in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8);
      pfVar2 = Vec3<float>::operator[](in_RDI,local_14);
      *pfVar2 = in_stack_ffffffffffffffd0;
      local_14 = local_14 + 1;
    }
    VVar3.x = Vec3<float>::length2((Vec3<float> *)0x187940);
    VVar3.y = (float)extraout_XMM0_Db;
  } while (1.0 < VVar3.x);
  VVar3.z = 1.0;
  return VVar3;
}

Assistant:

Vec
solidSphereRand (Rand &rand)
{
    Vec v;

    do
    {
	for (unsigned int i = 0; i < Vec::dimensions(); i++)
	    v[i] = (typename Vec::BaseType) rand.nextf (-1, 1);
    }
    while (v.length2() > 1);

    return v;
}